

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  undefined1 *puVar1;
  char cVar2;
  Curl_share *pCVar3;
  curl_trc_feat *pcVar4;
  int iVar5;
  size_t sVar6;
  Curl_addrinfo *pCVar7;
  void *pvVar8;
  Curl_dns_entry *pCVar9;
  char *pcVar10;
  Curl_addrinfo *pCVar11;
  Curl_addrinfo *addr;
  Curl_hash *h;
  size_t in_R8;
  curl_slist *pcVar12;
  Curl_addrinfo *cahead;
  curl_off_t port;
  Curl_str source;
  char *host;
  Curl_str target;
  curl_off_t num;
  char entry_id [262];
  size_t local_1b8;
  Curl_str local_1b0;
  char *local_1a0;
  Curl_hash *local_198;
  char *local_190;
  Curl_str local_188;
  curl_off_t local_178 [8];
  char local_138 [264];
  
  pCVar3 = data->share;
  if ((pCVar3 == (Curl_share *)0x0) || ((pCVar3->specifier & 8) == 0)) {
    if (data->multi == (Curl_multi *)0x0) {
      return CURLE_FAILED_INIT;
    }
    h = &(data->multi->dnscache).entries;
  }
  else {
    h = &(pCVar3->dnscache).entries;
  }
  puVar1 = &(data->state).field_0x7c0;
  *puVar1 = *puVar1 & 0xfb;
  pcVar12 = (data->state).resolve;
  if (pcVar12 != (curl_slist *)0x0) {
    do {
      local_1a0 = pcVar12->data;
      if (local_1a0 != (char *)0x0) {
        if (*local_1a0 == '-') {
          local_178[0] = 0;
          local_1a0 = local_1a0 + 1;
          iVar5 = Curl_str_single(&local_1a0,'[');
          if (iVar5 == 0) {
            iVar5 = Curl_str_until(&local_1a0,&local_1b0,0x2e,']');
            if (iVar5 != 0) goto LAB_00132b61;
            iVar5 = Curl_str_single(&local_1a0,']');
          }
          else {
            iVar5 = Curl_str_until(&local_1a0,&local_1b0,0x1000,':');
          }
          if (((iVar5 == 0) && (iVar5 = Curl_str_single(&local_1a0,':'), iVar5 == 0)) &&
             (iVar5 = Curl_str_number(&local_1a0,local_178,0xffff), iVar5 == 0)) {
            sVar6 = create_dnscache_id(local_1b0.str,
                                       CONCAT44(local_1b0.len._4_4_,(uint)local_1b0.len),
                                       (int)local_178[0],local_138,in_R8);
            if (&(data->share->dnscache).entries == h && data->share != (Curl_share *)0x0) {
              Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
            }
            Curl_hash_delete(h,local_138,sVar6 + 1);
            if (&(data->share->dnscache).entries == h && data->share != (Curl_share *)0x0) {
              Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
            }
          }
        }
        else {
          local_1b8 = 0;
          cVar2 = *local_1a0;
          if (cVar2 == '+') {
            local_1a0 = local_1a0 + 1;
          }
          iVar5 = Curl_str_single(&local_1a0,'[');
          if (iVar5 == 0) {
            iVar5 = Curl_str_until(&local_1a0,&local_1b0,0x2e,']');
            if (iVar5 != 0) goto LAB_00132b61;
            iVar5 = Curl_str_single(&local_1a0,']');
          }
          else {
            iVar5 = Curl_str_until(&local_1a0,&local_1b0,0x1000,':');
          }
          if (iVar5 == 0) {
            iVar5 = Curl_str_single(&local_1a0,':');
            if ((((iVar5 != 0) ||
                 (iVar5 = Curl_str_number(&local_1a0,(curl_off_t *)&local_1b8,0xffff), iVar5 != 0))
                || (iVar5 = Curl_str_single(&local_1a0,':'), iVar5 != 0)) || (*local_1a0 == '\0')) {
              cahead = (Curl_addrinfo *)0x0;
LAB_00132bed:
              Curl_failf(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'",pcVar12->data);
              Curl_freeaddrinfo(cahead);
              return CURLE_SETOPT_OPTION_SYNTAX;
            }
            local_190 = local_1a0;
            pCVar11 = (Curl_addrinfo *)0x0;
            cahead = (Curl_addrinfo *)0x0;
            local_198 = h;
            do {
              iVar5 = Curl_str_single(&local_1a0,'[');
              if (iVar5 == 0) {
                iVar5 = Curl_str_until(&local_1a0,&local_188,0x2e,']');
                if ((iVar5 != 0) || (iVar5 = Curl_str_single(&local_1a0,']'), iVar5 != 0))
                goto LAB_00132bed;
LAB_001328c2:
                sVar6 = local_188.len;
                if (0x3f < local_188.len) goto LAB_00132bed;
                memcpy(local_178,local_188.str,local_188.len);
                *(undefined1 *)((long)local_178 + sVar6) = 0;
                pCVar7 = Curl_str2addr((char *)local_178,(int)local_1b8);
                if (pCVar7 == (Curl_addrinfo *)0x0) {
                  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
                     ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar4->log_level)))) {
                    Curl_infof(data,"Resolve address \'%s\' found illegal",local_178);
                  }
                  goto LAB_00132bed;
                }
                addr = pCVar7;
                if (pCVar11 != (Curl_addrinfo *)0x0) {
                  pCVar11->ai_next = pCVar7;
                  addr = cahead;
                }
                iVar5 = Curl_str_single(&local_1a0,',');
                if (iVar5 != 0) break;
              }
              else {
                iVar5 = Curl_str_until(&local_1a0,&local_188,0x1000,',');
                if (iVar5 == 0) goto LAB_001328c2;
                iVar5 = Curl_str_single(&local_1a0,',');
                pCVar7 = pCVar11;
                addr = cahead;
                if (iVar5 != 0) goto LAB_00132bed;
              }
              pCVar11 = pCVar7;
              cahead = addr;
            } while (*local_1a0 != '\0');
            if (addr == (Curl_addrinfo *)0x0) {
              cahead = (Curl_addrinfo *)0x0;
              goto LAB_00132bed;
            }
            sVar6 = create_dnscache_id(local_1b0.str,
                                       CONCAT44(local_1b0.len._4_4_,(uint)local_1b0.len),
                                       (int)local_1b8,local_138,in_R8);
            if (&(data->share->dnscache).entries == local_198 && data->share != (Curl_share *)0x0) {
              Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
            }
            h = local_198;
            pvVar8 = Curl_hash_pick(local_198,local_138,sVar6 + 1);
            if (pvVar8 != (void *)0x0) {
              if ((((data->set).field_0x897 & 0x40) != 0) &&
                 ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar4->log_level)))) {
                Curl_infof(data,"RESOLVE %.*s:%ld - old addresses discarded",
                           (ulong)(uint)local_1b0.len,local_1b0.str,local_1b8);
              }
              h = local_198;
              Curl_hash_delete(local_198,local_138,sVar6 + 1);
            }
            in_R8 = CONCAT44(local_1b0.len._4_4_,(uint)local_1b0.len);
            pCVar9 = dnscache_add_addr(data,(Curl_dnscache *)h,addr,local_1b0.str,in_R8,
                                       (int)local_1b8,cVar2 != '+');
            if (pCVar9 == (Curl_dns_entry *)0x0) {
              if (&(data->share->dnscache).entries != h || data->share == (Curl_share *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
              Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
              return CURLE_OUT_OF_MEMORY;
            }
            pCVar9->refcount = pCVar9->refcount - 1;
            if (&(data->share->dnscache).entries == h && data->share != (Curl_share *)0x0) {
              Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
            }
            if ((((data->set).field_0x897 & 0x40) != 0) &&
               ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                (0 < pcVar4->log_level)))) {
              pcVar10 = " (non-permanent)";
              if (cVar2 != '+') {
                pcVar10 = "";
              }
              in_R8 = local_1b8;
              Curl_infof(data,"Added %.*s:%ld:%s to DNS cache%s",(ulong)(uint)local_1b0.len,
                         local_1b0.str,local_1b8,local_190,pcVar10);
            }
            iVar5 = Curl_str_casecompare(&local_1b0,"*");
            if (iVar5 != 0) {
              if ((((data->set).field_0x897 & 0x40) != 0) &&
                 ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar4->log_level)))) {
                Curl_infof(data,"RESOLVE *:%ld using wildcard",local_1b8);
              }
              puVar1 = &(data->state).field_0x7c0;
              *puVar1 = *puVar1 | 4;
            }
          }
        }
      }
LAB_00132b61:
      pcVar12 = pcVar12->next;
    } while (pcVar12 != (curl_slist *)0x0);
  }
  (data->state).resolve = (curl_slist *)0x0;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct Curl_dnscache *dnscache = dnscache_get(data);
  struct curl_slist *hostp;

  if(!dnscache)
    return CURLE_FAILED_INIT;

  /* Default is no wildcard found */
  data->state.wildcard_resolve = FALSE;

  for(hostp = data->state.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    const char *host = hostp->data;
    struct Curl_str source;
    if(!host)
      continue;
    if(*host == '-') {
      curl_off_t num = 0;
      size_t entry_len;
      host++;
      if(!Curl_str_single(&host, '[')) {
        if(Curl_str_until(&host, &source, MAX_IPADR_LEN, ']') ||
           Curl_str_single(&host, ']') ||
           Curl_str_single(&host, ':'))
          continue;
      }
      else {
        if(Curl_str_until(&host, &source, 4096, ':') ||
           Curl_str_single(&host, ':')) {
          continue;
        }
      }

      if(!Curl_str_number(&host, &num, 0xffff)) {
        /* Create an entry id, based upon the hostname and port */
        entry_len = create_dnscache_id(Curl_str(&source),
                                       Curl_strlen(&source), (int)num,
                                       entry_id, sizeof(entry_id));
        dnscache_lock(data, dnscache);
        /* delete entry, ignore if it did not exist */
        Curl_hash_delete(&dnscache->entries, entry_id, entry_len + 1);
        dnscache_unlock(data, dnscache);
      }
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      const char *addresses = NULL;
#endif
      curl_off_t port = 0;
      bool permanent = TRUE;
      bool error = TRUE;

      if(*host == '+') {
        host++;
        permanent = FALSE;
      }
      if(!Curl_str_single(&host, '[')) {
        if(Curl_str_until(&host, &source, MAX_IPADR_LEN, ']') ||
           Curl_str_single(&host, ']'))
          continue;
      }
      else {
        if(Curl_str_until(&host, &source, 4096, ':'))
          continue;
      }
      if(Curl_str_single(&host, ':') ||
         Curl_str_number(&host, &port, 0xffff) ||
         Curl_str_single(&host, ':'))
        goto err;

#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = host;
#endif

      /* start the address section */
      while(*host) {
        struct Curl_str target;
        struct Curl_addrinfo *ai;

        if(!Curl_str_single(&host, '[')) {
          if(Curl_str_until(&host, &target, MAX_IPADR_LEN, ']') ||
             Curl_str_single(&host, ']'))
            goto err;
        }
        else {
          if(Curl_str_until(&host, &target, 4096, ',')) {
            if(Curl_str_single(&host, ','))
              goto err;
            /* survive nothing but just a comma */
            continue;
          }
        }
#ifndef USE_IPV6
        if(memchr(target.str, ':', target.len)) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.",
                address);
          if(Curl_str_single(&host, ','))
            goto err;
          continue;
        }
#endif

        if(Curl_strlen(&target) >= sizeof(address))
          goto err;

        memcpy(address, Curl_str(&target), Curl_strlen(&target));
        address[Curl_strlen(&target)] = '\0';

        ai = Curl_str2addr(address, (int)port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
        if(Curl_str_single(&host, ','))
          break;
      }

      if(!head)
        goto err;

      error = FALSE;
err:
      if(error) {
        failf(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'",
              hostp->data);
        Curl_freeaddrinfo(head);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_len = create_dnscache_id(Curl_str(&source), Curl_strlen(&source),
                                     (int)port,
                                     entry_id, sizeof(entry_id));

      dnscache_lock(data, dnscache);

      /* See if it is already in our dns cache */
      dns = Curl_hash_pick(&dnscache->entries, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %.*s:%" CURL_FORMAT_CURL_OFF_T
              " - old addresses discarded", (int)Curl_strlen(&source),
              Curl_str(&source), port);
        /* delete old entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as permanent.
         3. when adding a non-permanent entry, we want it to remove and
            replace an existing permanent entry.
         4. when adding a non-permanent entry, we want it to get a "fresh"
            timeout that starts _now_. */

        Curl_hash_delete(&dnscache->entries, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = dnscache_add_addr(data, dnscache, head, Curl_str(&source),
                              Curl_strlen(&source), (int)port, permanent);
      if(dns) {
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
        dns->refcount--;
      }

      dnscache_unlock(data, dnscache);

      if(!dns)
        return CURLE_OUT_OF_MEMORY;

#ifndef CURL_DISABLE_VERBOSE_STRINGS
      infof(data, "Added %.*s:%" CURL_FORMAT_CURL_OFF_T ":%s to DNS cache%s",
            (int)Curl_strlen(&source), Curl_str(&source), port, addresses,
            permanent ? "" : " (non-permanent)");
#endif

      /* Wildcard hostname */
      if(Curl_str_casecompare(&source, "*")) {
        infof(data, "RESOLVE *:%" CURL_FORMAT_CURL_OFF_T " using wildcard",
              port);
        data->state.wildcard_resolve = TRUE;
      }
    }
  }
  data->state.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}